

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Maybe<kj::CompressionParameters> *
kj::_::validateCompressionConfig
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,UnverifiedConfig *config,
          bool isAgreement)

{
  ushort uVar1;
  size_t sVar2;
  char *pcVar3;
  byte bVar4;
  bool bVar5;
  undefined1 uVar6;
  ushort uVar7;
  undefined4 uVar8;
  undefined7 in_register_00000011;
  bool bVar9;
  char *pcVar10;
  ulong unaff_R12;
  ulong uVar11;
  undefined1 uVar12;
  undefined4 uVar13;
  String result;
  String local_78;
  undefined4 local_5c;
  StringPtr local_58;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  uVar8 = (undefined4)CONCAT71(in_register_00000011,isAgreement);
  if ((config->serverMaxWindowBits).ptr.isSet == true) {
    sVar2 = (config->serverMaxWindowBits).ptr.field_1.value.size_;
    if (sVar2 == 0) goto LAB_003eae16;
    pcVar3 = (config->serverMaxWindowBits).ptr.field_1.value.ptr;
    heapString(&local_78,sVar2);
    pcVar10 = (char *)local_78.content.size_;
    if ((char *)local_78.content.size_ != (char *)0x0) {
      pcVar10 = local_78.content.ptr;
    }
    memcpy(pcVar10,pcVar3,sVar2);
    local_40 = local_78.content.ptr;
    if ((char *)local_78.content.size_ == (char *)0x0) {
      local_40 = "";
    }
    local_38 = (char *)(local_78.content.size_ + ((char *)local_78.content.size_ == (char *)0x0));
    StringPtr::tryParseAs<unsigned_long>(&local_58);
    local_48 = local_58.content.size_;
    bVar4 = (byte)local_58.content.ptr;
    sVar2 = local_78.content.size_;
    pcVar3 = local_78.content.ptr;
    if (local_78.content.ptr != (char *)0x0) {
      local_78.content.ptr = (char *)0x0;
      local_78.content.size_ = 0;
      (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                (local_78.content.disposer,pcVar3,1,sVar2,sVar2,0);
    }
    if ((bVar4 & (local_48 & 0xfffffffffffffff8) == 8) == 0) goto LAB_003eae16;
    bVar9 = !isAgreement;
    uVar13 = uVar8;
  }
  else {
    bVar9 = false;
    uVar13 = 0;
    local_48 = unaff_R12;
  }
  uVar12 = (undefined1)uVar13;
  if ((config->clientMaxWindowBits).ptr.isSet == true) {
    sVar2 = (config->clientMaxWindowBits).ptr.field_1.value.size_;
    if (sVar2 == 0) {
      if (isAgreement) goto LAB_003eae16;
      local_58.content.size_ = 0xf;
      uVar6 = 1;
    }
    else {
      pcVar3 = (config->clientMaxWindowBits).ptr.field_1.value.ptr;
      local_5c = uVar8;
      heapString(&local_78,sVar2);
      pcVar10 = (char *)local_78.content.size_;
      if ((char *)local_78.content.size_ != (char *)0x0) {
        pcVar10 = local_78.content.ptr;
      }
      memcpy(pcVar10,pcVar3,sVar2);
      local_40 = local_78.content.ptr;
      if ((char *)local_78.content.size_ == (char *)0x0) {
        local_40 = "";
      }
      local_38 = (char *)(local_78.content.size_ + ((char *)local_78.content.size_ == (char *)0x0));
      StringPtr::tryParseAs<unsigned_long>(&local_58);
      sVar2 = local_78.content.size_;
      pcVar3 = local_78.content.ptr;
      if (local_78.content.ptr != (char *)0x0) {
        local_78.content.ptr = (char *)0x0;
        local_78.content.size_ = 0;
        (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                  (local_78.content.disposer,pcVar3,1,sVar2,sVar2,0);
      }
      if (((byte)local_58.content.ptr & (local_58.content.size_ & 0xfffffffffffffff8) == 8) == 0) {
LAB_003eae16:
        (__return_storage_ptr__->ptr).isSet = false;
        return __return_storage_ptr__;
      }
      bVar5 = true;
      uVar6 = true;
      if ((char)local_5c != '\0') goto LAB_003eae05;
    }
  }
  else {
    local_58.content.size_ = local_48;
    bVar5 = bVar9;
    uVar6 = uVar12;
    if (isAgreement) {
LAB_003eae05:
      bVar9 = bVar5;
      uVar7._0_1_ = config->clientNoContextTakeover;
      uVar7._1_1_ = config->serverNoContextTakeover;
      uVar11 = local_58.content.size_;
      goto LAB_003eae26;
    }
  }
  uVar12 = uVar6;
  uVar1._0_1_ = config->clientNoContextTakeover;
  uVar1._1_1_ = config->serverNoContextTakeover;
  uVar7 = uVar1 << 8 | uVar1 >> 8;
  uVar11 = local_48;
  local_48 = local_58.content.size_;
LAB_003eae26:
  (__return_storage_ptr__->ptr).isSet = true;
  *(ushort *)&(__return_storage_ptr__->ptr).field_1 = uVar7;
  (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = bVar9;
  if (bVar9 != false) {
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar11;
  }
  (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = (bool)uVar12;
  if ((bool)uVar12 != false) {
    *(ulong *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_48;
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> validateCompressionConfig(UnverifiedConfig&& config,
    bool isAgreement) {
  // Verifies that the `config` is valid depending on whether we're validating a Request (offer) or
  // a Response (agreement). This essentially consumes the `UnverifiedConfig` and converts it into a
  // `CompressionParameters` struct.
  CompressionParameters result;

  KJ_IF_SOME(serverBits, config.serverMaxWindowBits) {
    if (serverBits.size() == 0) {
      // This means `server_max_window_bits` was passed without a value. Since a value is required,
      // this config is invalid.
      return kj::none;
    } else {
      KJ_IF_SOME(bits, kj::str(serverBits).tryParseAs<size_t>()) {
        if (bits < 8 || 15 < bits) {
          // Out of range -- invalid.
          return kj::none;
        }
        if (isAgreement) {
          result.inboundMaxWindowBits = bits;
        } else {
          result.outboundMaxWindowBits = bits;
        }
      } else {
        // Invalid ABNF, expected 1*DIGIT.
        return kj::none;
      }
    }
  }